

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O3

CharClass<wchar_t> * __thiscall
Centaurus::CharClass<wchar_t>::operator|=(CharClass<wchar_t> *this,Range<wchar_t> *r)

{
  Range<wchar_t> local_58;
  vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_> local_48;
  undefined1 local_30 [16];
  pointer pRStack_20;
  pointer local_18;
  
  local_58._vptr_Range = (_func_int **)&PTR__Range_001a05a8;
  local_58.m_start = r->m_start;
  local_58.m_end = r->m_end;
  operator|((CharClass<wchar_t> *)local_30,this,&local_58);
  local_48.
  super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       (this->m_ranges).
       super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_ranges).
  super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = local_18;
  local_48.
  super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>._M_impl
  .super__Vector_impl_data._M_start =
       (this->m_ranges).
       super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_48.
  super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>._M_impl
  .super__Vector_impl_data._M_finish =
       (this->m_ranges).
       super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (this->m_ranges).
  super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)local_30._8_8_;
  (this->m_ranges).
  super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>._M_impl
  .super__Vector_impl_data._M_finish = pRStack_20;
  register0x00001200 = ZEXT816(0) << 0x20;
  local_18 = (pointer)0x0;
  std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::~vector
            (&local_48);
  ~CharClass((CharClass<wchar_t> *)local_30);
  return this;
}

Assistant:

CharClass<TCHAR>& operator|=(const Range<TCHAR>& r)
    {
        return *this = *this | r;
    }